

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManCreateMiter(Aig_Man_t *p1,Aig_Man_t *p2,int Oper)

{
  Aig_Man_t *p;
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  
  if (p1->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x41e,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p2->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x41f,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p1->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(p1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x420,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p2->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(p2) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x421,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p1->nObjs[2] != p2->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p1) == Aig_ManCiNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x422,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  p = Aig_ManStart(p2->vObjs->nSize + p1->vObjs->nSize);
  p1->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar5 = 0; iVar5 < p1->vCis->nSize; iVar5 = iVar5 + 1) {
    pvVar1 = Vec_PtrEntry(p1->vCis,iVar5);
    pAVar2 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
  }
  for (iVar5 = 0; iVar5 < p1->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,iVar5);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
      pAVar3 = Aig_ObjChild0Copy(pAVar2);
      pAVar4 = Aig_ObjChild1Copy(pAVar2);
      pAVar3 = Aig_And(p,pAVar3,pAVar4);
      (pAVar2->field_5).pData = pAVar3;
    }
  }
  p2->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar5 = 0; iVar5 < p2->vCis->nSize; iVar5 = iVar5 + 1) {
    pvVar1 = Vec_PtrEntry(p2->vCis,iVar5);
    pAVar2 = Aig_ManCi(p,iVar5);
    *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar2;
  }
  for (iVar5 = 0; iVar5 < p2->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p2->vObjs,iVar5);
    if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
      pAVar3 = Aig_ObjChild0Copy(pAVar2);
      pAVar4 = Aig_ObjChild1Copy(pAVar2);
      pAVar3 = Aig_And(p,pAVar3,pAVar4);
      (pAVar2->field_5).pData = pAVar3;
    }
  }
  switch(Oper) {
  case 0:
    pAVar2 = Aig_ManCo(p1,0);
    pAVar2 = Aig_ObjChild0Copy(pAVar2);
    pAVar3 = Aig_ManCo(p2,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    pAVar2 = Aig_Exor(p,pAVar2,pAVar3);
    goto LAB_0057687e;
  case 1:
    pAVar2 = Aig_ManCo(p1,0);
    pAVar2 = Aig_ObjChild0Copy(pAVar2);
    pAVar3 = Aig_ManCo(p2,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    pAVar3 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
    break;
  case 2:
    pAVar2 = Aig_ManCo(p1,0);
    pAVar2 = Aig_ObjChild0Copy(pAVar2);
    pAVar3 = Aig_ManCo(p2,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    pAVar2 = Aig_Or(p,pAVar2,pAVar3);
    goto LAB_0057687e;
  case 3:
    pAVar2 = Aig_ManCo(p1,0);
    pAVar2 = Aig_ObjChild0Copy(pAVar2);
    pAVar3 = Aig_ManCo(p2,0);
    pAVar3 = Aig_ObjChild0Copy(pAVar3);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                  ,0x43a,"Aig_Man_t *Aig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  pAVar2 = Aig_And(p,pAVar2,pAVar3);
LAB_0057687e:
  Aig_ObjCreateCo(p,pAVar2);
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Aig_ManCreateMiter( Aig_Man_t * p1, Aig_Man_t * p2, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i;
    assert( Aig_ManRegNum(p1) == 0 );
    assert( Aig_ManRegNum(p2) == 0 );
    assert( Aig_ManCoNum(p1) == 1 );
    assert( Aig_ManCoNum(p2) == 1 );
    assert( Aig_ManCiNum(p1) == Aig_ManCiNum(p2) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p1) + Aig_ManObjNumMax(p2) );
    // add first AIG
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add second AIG
    Aig_ManConst1(p2)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p2, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    Aig_ManForEachNode( p2, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the output
    if ( Oper == 0 ) // XOR
        pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else if ( Oper == 1 ) // implication is PO(p1) -> PO(p2)  ...  complement is PO(p1) & !PO(p2) 
        pObj = Aig_And( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p2,0))) );
    else if ( Oper == 2 ) // OR
        pObj = Aig_Or( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else if ( Oper == 3 ) // AND
        pObj = Aig_And( pNew, Aig_ObjChild0Copy(Aig_ManCo(p1,0)), Aig_ObjChild0Copy(Aig_ManCo(p2,0)) );
    else
        assert( 0 );
    Aig_ObjCreateCo( pNew, pObj );
    Aig_ManCleanup( pNew );
    return pNew;
}